

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int code;
  uchar *puVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  Fault local_b8;
  Fault f_1;
  long *local_a8;
  undefined1 local_a0 [8];
  DebugComparison<long_&,_int> _kjCondition;
  Fault local_68;
  Fault f;
  SyscallResult local_3c;
  undefined1 auStack_38 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  uchar *pos;
  size_t size;
  FdOutputStream *this_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  this_local = (FdOutputStream *)CONCAT44(in_register_00000034,__fd);
  data_local.ptr = (uchar *)__buf;
  pos = (uchar *)ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  puVar2 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  while( true ) {
    if (pos == (uchar *)0x0) {
      return (ssize_t)puVar2;
    }
    f.exception = (Exception *)auStack_38;
    local_3c = _::Debug::syscall<kj::FdOutputStream::write(kj::ArrayPtr<unsigned_char_const>)::__0>
                         ((anon_class_32_4_c03b49cc *)&f,false);
    pvVar3 = _::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
    if (pvVar3 == (void *)0x0) break;
    local_a8 = (long *)_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(long *)auStack_38);
    f_1.exception._4_4_ = 0;
    _::DebugExpression<long&>::operator>
              ((DebugComparison<long_&,_int> *)local_a0,(DebugExpression<long&> *)&local_a8,
               (int *)((long)&f_1.exception + 4));
    bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (!bVar1) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[23]>
                (&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x181,FAILED,"n > 0","_kjCondition,\"write() returned zero.\"",
                 (DebugComparison<long_&,_int> *)local_a0,(char (*) [23])"write() returned zero.");
      _::Debug::Fault::fatal(&local_b8);
    }
    puVar2 = pos + -(long)_auStack_38;
    pos = puVar2;
  }
  code = _::Debug::SyscallResult::getErrorNumber(&local_3c);
  _::Debug::Fault::Fault<int,int&>
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
             ,0x17f,code,"n = miniposix::write(fd, pos, size)","fd",&this->fd);
  _::Debug::Fault::fatal(&local_68);
}

Assistant:

void FdOutputStream::write(ArrayPtr<const byte> data) {
  auto size = data.size();
  auto pos = data.begin();

  while (size > 0) {
    miniposix::ssize_t n;
#if _WIN32 || __APPLE__
    // Windows and Mac suffer from bugs in which they will fail if given more than INT_MAX bytes
    // in a single write operation. We can just clamp the size since the loop will then handle
    // writing the rest. I don't know why these platforms don't just do this themselves.
    KJ_SYSCALL(n = miniposix::write(fd, pos, kj::min(size, WRITE_CLAMP_SIZE)), fd);
#else
    KJ_SYSCALL(n = miniposix::write(fd, pos, size), fd);
#endif
    KJ_ASSERT(n > 0, "write() returned zero.");
    pos += n;
    size -= n;
  }
}